

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

buffer_appender<char> __thiscall
fmt::v7::detail::float_writer<char>::prettify<fmt::v7::detail::buffer_appender<char>>
          (float_writer<char> *this,buffer_appender<char> it)

{
  char cVar1;
  bool bVar2;
  buffer_appender<char> bVar3;
  long lVar4;
  char *__last;
  ulong uVar5;
  char *__first;
  int iVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  bool bVar12;
  
  iVar7 = this->num_digits_;
  iVar6 = this->exp_;
  uVar10 = iVar6 + iVar7;
  if ((this->specs_).field_0x4 == '\x01') {
    cVar1 = *this->digits_;
    lVar4 = *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
                     + 0x10);
    uVar5 = lVar4 + 1;
    if (*(ulong *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                  0x18) < uVar5) {
      (*(code *)**(undefined8 **)
                  it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                (it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
      lVar4 = *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                              container + 0x10);
      uVar5 = lVar4 + 1;
    }
    *(ulong *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container + 0x10)
         = uVar5;
    *(char *)(*(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                              container + 8) + lVar4) = cVar1;
    iVar7 = this->num_digits_;
    iVar6 = (this->specs_).precision - iVar7;
    if ((1 < iVar7) || (((this->specs_).field_0x6 & 0x10) != 0)) {
      lVar4 = *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                              container + 0x10);
      uVar5 = lVar4 + 1;
      if (*(ulong *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                    0x18) < uVar5) {
        (*(code *)**(undefined8 **)
                    it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                  (it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
        lVar4 = *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                container + 0x10);
        uVar5 = lVar4 + 1;
      }
      cVar1 = this->decimal_point_;
      *(ulong *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                0x10) = uVar5;
      *(char *)(*(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                container + 8) + lVar4) = cVar1;
      iVar7 = this->num_digits_;
    }
    bVar3 = std::__copy_move<false,false,std::random_access_iterator_tag>::
            __copy_m<char_const*,fmt::v7::detail::buffer_appender<char>>
                      (this->digits_ + 1,this->digits_ + iVar7,it);
    uVar8 = *(uint *)&(this->specs_).field_0x4;
    if ((uVar8 >> 0x14 & 1) != 0 && 0 < iVar6) {
      iVar6 = iVar6 + 1;
      do {
        lVar4 = *(long *)((long)bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                container + 0x10);
        uVar5 = lVar4 + 1;
        if (*(ulong *)((long)bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                             container + 0x18) < uVar5) {
          (*(code *)**(undefined8 **)
                      bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                    (bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
          lVar4 = *(long *)((long)bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                  container + 0x10);
          uVar5 = lVar4 + 1;
        }
        *(ulong *)((long)bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
                  + 0x10) = uVar5;
        *(undefined1 *)
         (*(long *)((long)bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
                   + 8) + lVar4) = 0x30;
        iVar6 = iVar6 + -1;
      } while (1 < iVar6);
      uVar8 = *(uint *)&(this->specs_).field_0x4;
    }
    lVar4 = *(long *)((long)bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                            container + 0x10);
    uVar5 = lVar4 + 1;
    if (*(ulong *)((long)bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
                  + 0x18) < uVar5) {
      (*(code *)**(undefined8 **)
                  bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                (bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
      lVar4 = *(long *)((long)bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                              container + 0x10);
      uVar5 = lVar4 + 1;
    }
    *(ulong *)((long)bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
              0x10) = uVar5;
    *(byte *)(*(long *)((long)bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                              container + 8) + lVar4) = ((uVar8 >> 0x10 & 1) == 0) << 5 | 0x45;
    bVar3 = write_exponent<char,fmt::v7::detail::buffer_appender<char>>(uVar10 - 1,bVar3);
    return (buffer_appender<char>)
           bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  }
  if (-1 < iVar6) {
    bVar3 = std::__copy_move<false,false,std::random_access_iterator_tag>::
            __copy_m<char_const*,fmt::v7::detail::buffer_appender<char>>
                      (this->digits_,this->digits_ + iVar7,it);
    if (this->num_digits_ < (int)uVar10) {
      iVar7 = ((iVar6 + iVar7) - this->num_digits_) + 1;
      do {
        lVar4 = *(long *)((long)bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                container + 0x10);
        uVar5 = lVar4 + 1;
        if (*(ulong *)((long)bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                             container + 0x18) < uVar5) {
          (*(code *)**(undefined8 **)
                      bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                    (bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
          lVar4 = *(long *)((long)bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                  container + 0x10);
          uVar5 = lVar4 + 1;
        }
        *(ulong *)((long)bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
                  + 0x10) = uVar5;
        *(undefined1 *)
         (*(long *)((long)bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
                   + 8) + lVar4) = 0x30;
        iVar7 = iVar7 + -1;
      } while (1 < iVar7);
    }
    if ((((this->specs_).field_0x6 & 0x10) == 0) && (-1 < (this->specs_).precision)) {
      return (buffer_appender<char>)
             bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
    }
    lVar4 = *(long *)((long)bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                            container + 0x10);
    uVar5 = lVar4 + 1;
    if (*(ulong *)((long)bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
                  + 0x18) < uVar5) {
      (*(code *)**(undefined8 **)
                  bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                (bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
      lVar4 = *(long *)((long)bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                              container + 0x10);
      uVar5 = lVar4 + 1;
    }
    cVar1 = this->decimal_point_;
    *(ulong *)((long)bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
              0x10) = uVar5;
    *(char *)(*(long *)((long)bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                              container + 8) + lVar4) = cVar1;
    iVar7 = (this->specs_).precision;
    iVar6 = iVar7 - uVar10;
    if (iVar6 != 0 && (int)uVar10 <= iVar7) {
      iVar6 = iVar6 + 1;
      do {
        lVar4 = *(long *)((long)bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                container + 0x10);
        uVar5 = lVar4 + 1;
        if (*(ulong *)((long)bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                             container + 0x18) < uVar5) {
          (*(code *)**(undefined8 **)
                      bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                    (bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
          lVar4 = *(long *)((long)bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                  container + 0x10);
          uVar5 = lVar4 + 1;
        }
        *(ulong *)((long)bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
                  + 0x10) = uVar5;
        *(undefined1 *)
         (*(long *)((long)bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
                   + 8) + lVar4) = 0x30;
        iVar6 = iVar6 + -1;
      } while (1 < iVar6);
      return (buffer_appender<char>)
             bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
    }
    if ((this->specs_).field_0x4 == '\x02') {
      return (buffer_appender<char>)
             bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
    }
    lVar4 = *(long *)((long)bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                            container + 0x10);
    uVar5 = lVar4 + 1;
    if (*(ulong *)((long)bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
                  + 0x18) < uVar5) {
      (*(code *)**(undefined8 **)
                  bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                (bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
      lVar4 = *(long *)((long)bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                              container + 0x10);
      uVar5 = lVar4 + 1;
    }
    *(ulong *)((long)bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
              0x10) = uVar5;
    *(undefined1 *)
     (*(long *)((long)bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container + 8
               ) + lVar4) = 0x30;
    return (buffer_appender<char>)
           bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
  }
  if (0 < (int)uVar10) {
    uVar5 = (ulong)uVar10;
    it = std::__copy_move<false,false,std::random_access_iterator_tag>::
         __copy_m<char_const*,fmt::v7::detail::buffer_appender<char>>
                   (this->digits_,this->digits_ + uVar5,it);
    if (((this->specs_).field_0x6 & 0x10) != 0) {
      lVar4 = *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                              container + 0x10);
      uVar9 = lVar4 + 1;
      if (*(ulong *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                    0x18) < uVar9) {
        (*(code *)**(undefined8 **)
                    it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                  (it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
        lVar4 = *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                container + 0x10);
        uVar9 = lVar4 + 1;
      }
      cVar1 = this->decimal_point_;
      *(ulong *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                0x10) = uVar9;
      *(char *)(*(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                container + 8) + lVar4) = cVar1;
      bVar3 = std::__copy_move<false,false,std::random_access_iterator_tag>::
              __copy_m<char_const*,fmt::v7::detail::buffer_appender<char>>
                        (this->digits_ + uVar5,this->digits_ + this->num_digits_,it);
      iVar7 = (this->specs_).precision;
      iVar6 = this->num_digits_;
      iVar11 = iVar7 - iVar6;
      if (iVar11 == 0 || iVar7 < iVar6) {
        return (buffer_appender<char>)
               bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
      }
      if (iVar11 == 0 || iVar7 < iVar6) {
        return (buffer_appender<char>)
               bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
      }
      iVar11 = iVar11 + 1;
      do {
        lVar4 = *(long *)((long)bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                container + 0x10);
        uVar5 = lVar4 + 1;
        if (*(ulong *)((long)bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                             container + 0x18) < uVar5) {
          (*(code *)**(undefined8 **)
                      bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                    (bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
          lVar4 = *(long *)((long)bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                  container + 0x10);
          uVar5 = lVar4 + 1;
        }
        *(ulong *)((long)bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
                  + 0x10) = uVar5;
        *(undefined1 *)
         (*(long *)((long)bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
                   + 8) + lVar4) = 0x30;
        iVar11 = iVar11 + -1;
      } while (1 < iVar11);
      return (buffer_appender<char>)
             bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
    }
    uVar9 = (ulong)(uint)this->num_digits_;
    if ((int)uVar10 < this->num_digits_) {
      do {
        if (this->digits_[uVar9 - 1] != '0') goto LAB_003f30aa;
        uVar9 = uVar9 - 1;
      } while ((long)uVar5 < (long)uVar9);
    }
    else {
LAB_003f30aa:
      uVar8 = (uint)uVar9;
      bVar12 = uVar8 != uVar10;
      uVar10 = uVar8;
      if (bVar12) {
        lVar4 = *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                container + 0x10);
        uVar9 = lVar4 + 1;
        if (*(ulong *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
                      + 0x18) < uVar9) {
          (*(code *)**(undefined8 **)
                      it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                    (it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
          lVar4 = *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                  container + 0x10);
          uVar9 = lVar4 + 1;
        }
        cVar1 = this->decimal_point_;
        *(ulong *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                  0x10) = uVar9;
        *(char *)(*(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                  container + 8) + lVar4) = cVar1;
      }
    }
    __first = this->digits_ + uVar5;
    __last = this->digits_ + (int)uVar10;
    goto LAB_003f3197;
  }
  lVar4 = *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                   0x10);
  uVar5 = lVar4 + 1;
  if (*(ulong *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                0x18) < uVar5) {
    (*(code *)**(undefined8 **)
                it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
              (it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
    lVar4 = *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
                     + 0x10);
    uVar5 = lVar4 + 1;
  }
  *(ulong *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container + 0x10) =
       uVar5;
  *(undefined1 *)
   (*(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container + 8) +
   lVar4) = 0x30;
  iVar7 = -uVar10;
  uVar8 = this->num_digits_;
  if (uVar8 == 0) {
    iVar6 = (this->specs_).precision;
    iVar11 = iVar7;
    if (SBORROW4(iVar6,iVar7) != (int)(iVar6 + uVar10) < 0) {
      iVar11 = iVar6;
    }
    if (-1 < iVar6) {
      iVar7 = iVar11;
    }
    bVar12 = ((this->specs_).field_0x6 & 0x10) == 0;
LAB_003f3106:
    uVar8 = 0;
  }
  else {
    uVar10 = *(uint *)&(this->specs_).field_0x4 & 0x100000;
    bVar12 = uVar10 == 0;
    if (0 < (int)uVar8 && (char)(uVar10 >> 0x14) == '\0') {
      bVar12 = true;
      do {
        if (this->digits_[(ulong)uVar8 - 1] != '0') goto LAB_003f3109;
        bVar2 = 1 < (int)uVar8;
        uVar8 = uVar8 - 1;
      } while (bVar2);
      goto LAB_003f3106;
    }
  }
LAB_003f3109:
  if ((uVar8 == 0 && iVar7 == 0) && (bVar12)) {
    return (buffer_appender<char>)
           it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
  }
  lVar4 = *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                   0x10);
  uVar5 = lVar4 + 1;
  if (*(ulong *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                0x18) < uVar5) {
    (*(code *)**(undefined8 **)
                it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
              (it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
    lVar4 = *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
                     + 0x10);
    uVar5 = lVar4 + 1;
  }
  cVar1 = this->decimal_point_;
  *(ulong *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container + 0x10) =
       uVar5;
  *(char *)(*(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
                     + 8) + lVar4) = cVar1;
  if (0 < iVar7) {
    iVar7 = iVar7 + 1;
    do {
      lVar4 = *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                              container + 0x10);
      uVar5 = lVar4 + 1;
      if (*(ulong *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                    0x18) < uVar5) {
        (*(code *)**(undefined8 **)
                    it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                  (it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
        lVar4 = *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                container + 0x10);
        uVar5 = lVar4 + 1;
      }
      *(ulong *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                0x10) = uVar5;
      *(undefined1 *)
       (*(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container + 8)
       + lVar4) = 0x30;
      iVar7 = iVar7 + -1;
    } while (1 < iVar7);
  }
  __first = this->digits_;
  __last = __first + (int)uVar8;
LAB_003f3197:
  bVar3 = std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<char_const*,fmt::v7::detail::buffer_appender<char>>(__first,__last,it);
  return (buffer_appender<char>)
         bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
}

Assistant:

It prettify(It it) const {
    // pow(10, full_exp - 1) <= v <= pow(10, full_exp).
    int full_exp = num_digits_ + exp_;
    if (specs_.format == float_format::exp) {
      // Insert a decimal point after the first digit and add an exponent.
      *it++ = static_cast<Char>(*digits_);
      int num_zeros = specs_.precision - num_digits_;
      if (num_digits_ > 1 || specs_.showpoint) *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + 1, digits_ + num_digits_, it);
      if (num_zeros > 0 && specs_.showpoint)
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      *it++ = static_cast<Char>(specs_.upper ? 'E' : 'e');
      return write_exponent<Char>(full_exp - 1, it);
    }
    if (num_digits_ <= full_exp) {
      // 1234e7 -> 12340000000[.0+]
      it = copy_str<Char>(digits_, digits_ + num_digits_, it);
      it = std::fill_n(it, full_exp - num_digits_, static_cast<Char>('0'));
      if (specs_.showpoint || specs_.precision < 0) {
        *it++ = decimal_point_;
        int num_zeros = specs_.precision - full_exp;
        if (num_zeros <= 0) {
          if (specs_.format != float_format::fixed)
            *it++ = static_cast<Char>('0');
          return it;
        }
#ifdef FMT_FUZZ
        if (num_zeros > 5000)
          throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else if (full_exp > 0) {
      // 1234e-2 -> 12.34[0+]
      it = copy_str<Char>(digits_, digits_ + full_exp, it);
      if (!specs_.showpoint) {
        // Remove trailing zeros.
        int num_digits = num_digits_;
        while (num_digits > full_exp && digits_[num_digits - 1] == '0')
          --num_digits;
        if (num_digits != full_exp) *it++ = decimal_point_;
        return copy_str<Char>(digits_ + full_exp, digits_ + num_digits, it);
      }
      *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + full_exp, digits_ + num_digits_, it);
      if (specs_.precision > num_digits_) {
        // Add trailing zeros.
        int num_zeros = specs_.precision - num_digits_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else {
      // 1234e-6 -> 0.001234
      *it++ = static_cast<Char>('0');
      int num_zeros = -full_exp;
      int num_digits = num_digits_;
      if (num_digits == 0 && specs_.precision >= 0 &&
          specs_.precision < num_zeros) {
        num_zeros = specs_.precision;
      }
      // Remove trailing zeros.
      if (!specs_.showpoint)
        while (num_digits > 0 && digits_[num_digits - 1] == '0') --num_digits;
      if (num_zeros != 0 || num_digits != 0 || specs_.showpoint) {
        *it++ = decimal_point_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
        it = copy_str<Char>(digits_, digits_ + num_digits, it);
      }
    }
    return it;
  }